

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
          (string *__return_storage_ptr__,SystemTools *this,bool collapse)

{
  undefined1 local_840 [8];
  string path;
  char *cwd;
  char buf [2048];
  bool collapse_local;
  
  buf[0x7ff] = (byte)this & 1;
  path.field_2._8_8_ = Getcwd((char *)&cwd,0x800);
  std::__cxx11::string::string((string *)local_840);
  if (path.field_2._8_8_ != 0) {
    std::__cxx11::string::operator=((string *)local_840,(char *)path.field_2._8_8_);
  }
  if ((buf[0x7ff] & 1U) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_840);
  }
  else {
    CollapseFullPath(__return_storage_ptr__,(string *)local_840);
  }
  std::__cxx11::string::~string((string *)local_840);
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string SystemTools::GetCurrentWorkingDirectory(bool collapse)
{
  char buf[2048];
  const char* cwd = Getcwd(buf, 2048);
  kwsys_stl::string path;
  if ( cwd )
    {
    path = cwd;
    }
  if(collapse)
    {
    return SystemTools::CollapseFullPath(path);
    }
  return path;
}